

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O2

bool __thiscall cmCTestMemCheckHandler::InitializeMemoryChecking(cmCTestMemCheckHandler *this)

{
  string *filename;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  string *__rhs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  cmCTest *pcVar1;
  int iVar2;
  size_type sVar3;
  bool bVar4;
  long lVar5;
  ostream *poVar6;
  string memoryTesterOptions;
  string extraOptions;
  allocator<char> local_229;
  string local_228;
  string suppressionsOption;
  string local_1e8;
  string outputFile;
  string testerName;
  
  (this->MemoryTesterEnvironmentVariable)._M_string_length = 0;
  *(this->MemoryTesterEnvironmentVariable)._M_dataplus._M_p = '\0';
  (this->MemoryTester)._M_string_length = 0;
  *(this->MemoryTester)._M_dataplus._M_p = '\0';
  pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&memoryTesterOptions,"MemoryCheckCommand",(allocator<char> *)&extraOptions);
  cmCTest::GetCTestConfiguration(&testerName,pcVar1,&memoryTesterOptions);
  bVar4 = cmsys::SystemTools::FileExists(&testerName);
  filename = &this->MemoryTester;
  std::__cxx11::string::~string((string *)&testerName);
  std::__cxx11::string::~string((string *)&memoryTesterOptions);
  if (bVar4) {
    pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&memoryTesterOptions,"MemoryCheckCommand",(allocator<char> *)&extraOptions)
    ;
    cmCTest::GetCTestConfiguration(&testerName,pcVar1,&memoryTesterOptions);
    std::__cxx11::string::operator=((string *)filename,(string *)&testerName);
    std::__cxx11::string::~string((string *)&testerName);
    std::__cxx11::string::~string((string *)&memoryTesterOptions);
    cmsys::SystemTools::GetFilenameName(&testerName,filename);
    lVar5 = std::__cxx11::string::find((char *)&testerName,0x499f25);
    if (lVar5 == -1) {
      pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&extraOptions,"MemoryCheckType",(allocator<char> *)&suppressionsOption);
      cmCTest::GetCTestConfiguration(&memoryTesterOptions,pcVar1,&extraOptions);
      bVar4 = std::operator==(&memoryTesterOptions,"Valgrind");
      std::__cxx11::string::~string((string *)&memoryTesterOptions);
      std::__cxx11::string::~string((string *)&extraOptions);
      if (bVar4) goto LAB_00175382;
      lVar5 = std::__cxx11::string::find((char *)&testerName,0x499f3e);
      if (lVar5 == -1) {
        lVar5 = std::__cxx11::string::find((char *)&testerName,0x499f45);
        if (lVar5 == -1) {
          this->MemoryTesterStyle = 0;
        }
        else {
          this->MemoryTesterStyle = 3;
        }
      }
      else {
        this->MemoryTesterStyle = 2;
      }
    }
    else {
LAB_00175382:
      this->MemoryTesterStyle = 1;
    }
    std::__cxx11::string::~string((string *)&testerName);
  }
  else {
    pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&memoryTesterOptions,"PurifyCommand",(allocator<char> *)&extraOptions);
    cmCTest::GetCTestConfiguration(&testerName,pcVar1,&memoryTesterOptions);
    bVar4 = cmsys::SystemTools::FileExists(&testerName);
    std::__cxx11::string::~string((string *)&testerName);
    std::__cxx11::string::~string((string *)&memoryTesterOptions);
    if (bVar4) {
      pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&memoryTesterOptions,"PurifyCommand",(allocator<char> *)&extraOptions);
      cmCTest::GetCTestConfiguration(&testerName,pcVar1,&memoryTesterOptions);
      std::__cxx11::string::operator=((string *)filename,(string *)&testerName);
      std::__cxx11::string::~string((string *)&testerName);
      std::__cxx11::string::~string((string *)&memoryTesterOptions);
      this->MemoryTesterStyle = 2;
    }
    else {
      pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&memoryTesterOptions,"ValgrindCommand",(allocator<char> *)&extraOptions);
      cmCTest::GetCTestConfiguration(&testerName,pcVar1,&memoryTesterOptions);
      bVar4 = cmsys::SystemTools::FileExists(&testerName);
      std::__cxx11::string::~string((string *)&testerName);
      std::__cxx11::string::~string((string *)&memoryTesterOptions);
      if (bVar4) {
        pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&memoryTesterOptions,"ValgrindCommand",(allocator<char> *)&extraOptions
                  );
        cmCTest::GetCTestConfiguration(&testerName,pcVar1,&memoryTesterOptions);
        std::__cxx11::string::operator=((string *)filename,(string *)&testerName);
        std::__cxx11::string::~string((string *)&testerName);
        std::__cxx11::string::~string((string *)&memoryTesterOptions);
        this->MemoryTesterStyle = 1;
      }
      else {
        pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&memoryTesterOptions,"BoundsCheckerCommand",
                   (allocator<char> *)&extraOptions);
        cmCTest::GetCTestConfiguration(&testerName,pcVar1,&memoryTesterOptions);
        bVar4 = cmsys::SystemTools::FileExists(&testerName);
        std::__cxx11::string::~string((string *)&testerName);
        std::__cxx11::string::~string((string *)&memoryTesterOptions);
        if (bVar4) {
          pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&memoryTesterOptions,"BoundsCheckerCommand",
                     (allocator<char> *)&extraOptions);
          cmCTest::GetCTestConfiguration(&testerName,pcVar1,&memoryTesterOptions);
          std::__cxx11::string::operator=((string *)filename,(string *)&testerName);
          std::__cxx11::string::~string((string *)&testerName);
          std::__cxx11::string::~string((string *)&memoryTesterOptions);
          this->MemoryTesterStyle = 3;
        }
      }
    }
  }
  pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&memoryTesterOptions,"MemoryCheckType",(allocator<char> *)&extraOptions);
  cmCTest::GetCTestConfiguration(&testerName,pcVar1,&memoryTesterOptions);
  bVar4 = std::operator==(&testerName,"AddressSanitizer");
  std::__cxx11::string::~string((string *)&testerName);
  std::__cxx11::string::~string((string *)&memoryTesterOptions);
  if (bVar4) {
    pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&memoryTesterOptions,"CMakeCommand",(allocator<char> *)&extraOptions);
    cmCTest::GetCTestConfiguration(&testerName,pcVar1,&memoryTesterOptions);
    std::__cxx11::string::operator=((string *)filename,(string *)&testerName);
    std::__cxx11::string::~string((string *)&testerName);
    std::__cxx11::string::~string((string *)&memoryTesterOptions);
    this->MemoryTesterStyle = 4;
    this->LogWithPID = true;
  }
  pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&memoryTesterOptions,"MemoryCheckType",(allocator<char> *)&extraOptions);
  cmCTest::GetCTestConfiguration(&testerName,pcVar1,&memoryTesterOptions);
  bVar4 = std::operator==(&testerName,"LeakSanitizer");
  std::__cxx11::string::~string((string *)&testerName);
  std::__cxx11::string::~string((string *)&memoryTesterOptions);
  if (bVar4) {
    pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&memoryTesterOptions,"CMakeCommand",(allocator<char> *)&extraOptions);
    cmCTest::GetCTestConfiguration(&testerName,pcVar1,&memoryTesterOptions);
    std::__cxx11::string::operator=((string *)filename,(string *)&testerName);
    std::__cxx11::string::~string((string *)&testerName);
    std::__cxx11::string::~string((string *)&memoryTesterOptions);
    this->MemoryTesterStyle = 5;
    this->LogWithPID = true;
  }
  pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&memoryTesterOptions,"MemoryCheckType",(allocator<char> *)&extraOptions);
  cmCTest::GetCTestConfiguration(&testerName,pcVar1,&memoryTesterOptions);
  bVar4 = std::operator==(&testerName,"ThreadSanitizer");
  std::__cxx11::string::~string((string *)&testerName);
  std::__cxx11::string::~string((string *)&memoryTesterOptions);
  if (bVar4) {
    pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&memoryTesterOptions,"CMakeCommand",(allocator<char> *)&extraOptions);
    cmCTest::GetCTestConfiguration(&testerName,pcVar1,&memoryTesterOptions);
    std::__cxx11::string::operator=((string *)filename,(string *)&testerName);
    std::__cxx11::string::~string((string *)&testerName);
    std::__cxx11::string::~string((string *)&memoryTesterOptions);
    this->MemoryTesterStyle = 6;
    this->LogWithPID = true;
  }
  pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&memoryTesterOptions,"MemoryCheckType",(allocator<char> *)&extraOptions);
  cmCTest::GetCTestConfiguration(&testerName,pcVar1,&memoryTesterOptions);
  bVar4 = std::operator==(&testerName,"MemorySanitizer");
  std::__cxx11::string::~string((string *)&testerName);
  std::__cxx11::string::~string((string *)&memoryTesterOptions);
  if (bVar4) {
    pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&memoryTesterOptions,"CMakeCommand",(allocator<char> *)&extraOptions);
    cmCTest::GetCTestConfiguration(&testerName,pcVar1,&memoryTesterOptions);
    std::__cxx11::string::operator=((string *)filename,(string *)&testerName);
    std::__cxx11::string::~string((string *)&testerName);
    std::__cxx11::string::~string((string *)&memoryTesterOptions);
    this->MemoryTesterStyle = 7;
    this->LogWithPID = true;
  }
  pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&memoryTesterOptions,"MemoryCheckType",(allocator<char> *)&extraOptions);
  cmCTest::GetCTestConfiguration(&testerName,pcVar1,&memoryTesterOptions);
  bVar4 = std::operator==(&testerName,"UndefinedBehaviorSanitizer");
  std::__cxx11::string::~string((string *)&testerName);
  std::__cxx11::string::~string((string *)&memoryTesterOptions);
  if (bVar4) {
    pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&memoryTesterOptions,"CMakeCommand",(allocator<char> *)&extraOptions);
    cmCTest::GetCTestConfiguration(&testerName,pcVar1,&memoryTesterOptions);
    std::__cxx11::string::operator=((string *)filename,(string *)&testerName);
    std::__cxx11::string::~string((string *)&testerName);
    std::__cxx11::string::~string((string *)&memoryTesterOptions);
    this->MemoryTesterStyle = 8;
    this->LogWithPID = true;
  }
  else if (this->MemoryTesterStyle == 0) {
    pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&memoryTesterOptions,"MemoryCheckType",(allocator<char> *)&extraOptions);
    cmCTest::GetCTestConfiguration(&testerName,pcVar1,&memoryTesterOptions);
    std::__cxx11::string::~string((string *)&memoryTesterOptions);
    bVar4 = std::operator==(&testerName,"Purify");
    if (bVar4) {
      iVar2 = 2;
LAB_00175a7e:
      this->MemoryTesterStyle = iVar2;
    }
    else {
      bVar4 = std::operator==(&testerName,"BoundsChecker");
      if (bVar4) {
        iVar2 = 3;
        goto LAB_00175a7e;
      }
      bVar4 = std::operator==(&testerName,"Valgrind");
      if (bVar4) {
        iVar2 = 1;
        goto LAB_00175a7e;
      }
    }
    std::__cxx11::string::~string((string *)&testerName);
  }
  if ((this->MemoryTester)._M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&testerName);
    poVar6 = std::operator<<((ostream *)&testerName,
                             "Memory checker (MemoryCheckCommand) not set, or cannot find the specified program."
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestMemCheckHandler.cxx"
                 ,0x1fb,memoryTesterOptions._M_dataplus._M_p,
                 (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
    std::__cxx11::string::~string((string *)&memoryTesterOptions);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&testerName);
    return false;
  }
  memoryTesterOptions._M_dataplus._M_p = (pointer)&memoryTesterOptions.field_2;
  memoryTesterOptions._M_string_length = 0;
  memoryTesterOptions.field_2._M_local_buf[0] = '\0';
  pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&extraOptions,"MemoryCheckCommandOptions",
             (allocator<char> *)&suppressionsOption);
  cmCTest::GetCTestConfiguration(&testerName,pcVar1,&extraOptions);
  sVar3 = testerName._M_string_length;
  std::__cxx11::string::~string((string *)&testerName);
  std::__cxx11::string::~string((string *)&extraOptions);
  if (sVar3 == 0) {
    pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&extraOptions,"ValgrindCommandOptions",
               (allocator<char> *)&suppressionsOption);
    cmCTest::GetCTestConfiguration(&testerName,pcVar1,&extraOptions);
    sVar3 = testerName._M_string_length;
    std::__cxx11::string::~string((string *)&testerName);
    std::__cxx11::string::~string((string *)&extraOptions);
    if (sVar3 != 0) {
      pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&extraOptions,"ValgrindCommandOptions",
                 (allocator<char> *)&suppressionsOption);
      cmCTest::GetCTestConfiguration(&testerName,pcVar1,&extraOptions);
      goto LAB_00175c2f;
    }
  }
  else {
    pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&extraOptions,"MemoryCheckCommandOptions",
               (allocator<char> *)&suppressionsOption);
    cmCTest::GetCTestConfiguration(&testerName,pcVar1,&extraOptions);
LAB_00175c2f:
    std::__cxx11::string::operator=((string *)&memoryTesterOptions,(string *)&testerName);
    std::__cxx11::string::~string((string *)&testerName);
    std::__cxx11::string::~string((string *)&extraOptions);
  }
  cmSystemTools::ParseArguments
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&testerName,&memoryTesterOptions);
  this_00 = &this->MemoryTesterOptions;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(this_00,&testerName);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&testerName);
  cmCTest::GetBinaryDir_abi_cxx11_
            (&extraOptions,(this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest);
  std::operator+(&testerName,&extraOptions,"/Testing/Temporary/MemoryChecker.??.log");
  __rhs = &this->MemoryTesterOutputFile;
  std::__cxx11::string::operator=((string *)__rhs,(string *)&testerName);
  std::__cxx11::string::~string((string *)&testerName);
  std::__cxx11::string::~string((string *)&extraOptions);
  if (this->MemoryTesterStyle - 1U < 8) {
    switch(this->MemoryTesterStyle) {
    case 1:
      if ((this->MemoryTesterOptions).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (this->MemoryTesterOptions).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[3]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                   (char (*) [3])0x4dcb7e);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[16]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                   (char (*) [16])"--tool=memcheck");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[17]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                   (char (*) [17])"--leak-check=yes");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[21]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                   (char (*) [21])"--show-reachable=yes");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[17]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                   (char (*) [17])"--num-callers=50");
      }
      pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&extraOptions,"MemoryCheckSuppressionFile",
                 (allocator<char> *)&suppressionsOption);
      cmCTest::GetCTestConfiguration(&testerName,pcVar1,&extraOptions);
      sVar3 = testerName._M_string_length;
      std::__cxx11::string::~string((string *)&testerName);
      std::__cxx11::string::~string((string *)&extraOptions);
      if (sVar3 != 0) {
        pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&extraOptions,"MemoryCheckSuppressionFile",
                   (allocator<char> *)&suppressionsOption);
        cmCTest::GetCTestConfiguration(&testerName,pcVar1,&extraOptions);
        bVar4 = cmsys::SystemTools::FileExists(&testerName);
        std::__cxx11::string::~string((string *)&testerName);
        std::__cxx11::string::~string((string *)&extraOptions);
        if (!bVar4) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&testerName);
          poVar6 = std::operator<<((ostream *)&testerName,
                                   "Cannot find memory checker suppression file: ");
          pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&suppressionsOption,"MemoryCheckSuppressionFile",
                     (allocator<char> *)&outputFile);
          cmCTest::GetCTestConfiguration(&extraOptions,pcVar1,&suppressionsOption);
          poVar6 = std::operator<<(poVar6,(string *)&extraOptions);
          std::endl<char,std::char_traits<char>>(poVar6);
          std::__cxx11::string::~string((string *)&extraOptions);
          std::__cxx11::string::~string((string *)&suppressionsOption);
          pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestMemCheckHandler.cxx"
                       ,0x221,extraOptions._M_dataplus._M_p,false);
          goto LAB_00176438;
        }
        pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&suppressionsOption,"MemoryCheckSuppressionFile",
                   (allocator<char> *)&outputFile);
        cmCTest::GetCTestConfiguration(&extraOptions,pcVar1,&suppressionsOption);
        std::operator+(&testerName,"--suppressions=",&extraOptions);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                   &testerName);
        std::__cxx11::string::~string((string *)&testerName);
        std::__cxx11::string::~string((string *)&extraOptions);
        std::__cxx11::string::~string((string *)&suppressionsOption);
      }
      std::operator+(&testerName,"--log-file=",__rhs);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->MemoryTesterDynamicOptions,&testerName);
      break;
    case 2:
      testerName._M_string_length = 0;
      testerName.field_2._M_local_buf[0] = '\0';
      testerName._M_dataplus._M_p = (pointer)&testerName.field_2;
      std::__cxx11::string::assign((char *)&testerName);
      std::__cxx11::string::append((string *)&testerName);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->MemoryTesterDynamicOptions,&testerName);
      break;
    case 3:
      std::__cxx11::string::_M_assign((string *)&this->BoundsCheckerXMLFile);
      cmCTest::GetBinaryDir_abi_cxx11_
                (&extraOptions,(this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest);
      std::operator+(&testerName,&extraOptions,"/Testing/Temporary/MemoryChecker.??.DPbd");
      std::__cxx11::string::~string((string *)&extraOptions);
      std::__cxx11::string::_M_assign((string *)&this->BoundsCheckerDPBDFile);
      this_01 = &this->MemoryTesterDynamicOptions;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[3]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
                 (char (*) [3])"/B");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
                 &testerName);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[3]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
                 (char (*) [3])"/X");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this_01,__rhs);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[3]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [3])"/M");
      break;
    default:
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[3]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->MemoryTesterDynamicOptions,(char (*) [3])"-E");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[4]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->MemoryTesterDynamicOptions,(char (*) [4])"env");
      testerName._M_string_length = 0;
      extraOptions._M_dataplus._M_p = (pointer)&extraOptions.field_2;
      extraOptions._M_string_length = 0;
      suppressionsOption._M_dataplus._M_p = (pointer)&suppressionsOption.field_2;
      suppressionsOption._M_string_length = 0;
      extraOptions.field_2._M_local_buf[0] = '\0';
      testerName.field_2._M_local_buf[0] = '\0';
      suppressionsOption.field_2._M_local_buf[0] = '\0';
      pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      testerName._M_dataplus._M_p = (pointer)&testerName.field_2;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_228,"MemoryCheckSanitizerOptions",(allocator<char> *)&local_1e8);
      cmCTest::GetCTestConfiguration(&outputFile,pcVar1,&local_228);
      sVar3 = outputFile._M_string_length;
      std::__cxx11::string::~string((string *)&outputFile);
      std::__cxx11::string::~string((string *)&local_228);
      if (sVar3 != 0) {
        pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1e8,"MemoryCheckSanitizerOptions",&local_229);
        cmCTest::GetCTestConfiguration(&local_228,pcVar1,&local_1e8);
        std::operator+(&outputFile,":",&local_228);
        std::__cxx11::string::operator=((string *)&extraOptions,(string *)&outputFile);
        std::__cxx11::string::~string((string *)&outputFile);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::~string((string *)&local_1e8);
      }
      pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_228,"MemoryCheckSuppressionFile",(allocator<char> *)&local_1e8);
      cmCTest::GetCTestConfiguration(&outputFile,pcVar1,&local_228);
      std::__cxx11::string::~string((string *)&outputFile);
      std::__cxx11::string::~string((string *)&local_228);
      if (outputFile._M_string_length != 0) {
        pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1e8,"MemoryCheckSuppressionFile",&local_229);
        cmCTest::GetCTestConfiguration(&local_228,pcVar1,&local_1e8);
        std::operator+(&outputFile,":suppressions=",&local_228);
        std::__cxx11::string::operator=((string *)&suppressionsOption,(string *)&outputFile);
        std::__cxx11::string::~string((string *)&outputFile);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::~string((string *)&local_1e8);
      }
      if (this->MemoryTesterStyle - 4U < 5) {
        std::__cxx11::string::assign((char *)&testerName);
      }
      std::operator+(&local_1e8,&testerName,"=log_path=\'");
      std::operator+(&local_228,&local_1e8,__rhs);
      std::operator+(&outputFile,&local_228,"\'");
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::operator+(&local_1e8,&outputFile,&suppressionsOption);
      std::operator+(&local_228,&local_1e8,&extraOptions);
      std::__cxx11::string::operator=
                ((string *)&this->MemoryTesterEnvironmentVariable,(string *)&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&outputFile);
      std::__cxx11::string::~string((string *)&suppressionsOption);
      std::__cxx11::string::~string((string *)&extraOptions);
    }
    std::__cxx11::string::~string((string *)&testerName);
    bVar4 = true;
    InitializeResultsVectors(this);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&testerName);
    poVar6 = std::operator<<((ostream *)&testerName,"Do not understand memory checker: ");
    poVar6 = std::operator<<(poVar6,(string *)filename);
    std::endl<char,std::char_traits<char>>(poVar6);
    pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestMemCheckHandler.cxx"
                 ,0x289,extraOptions._M_dataplus._M_p,false);
LAB_00176438:
    std::__cxx11::string::~string((string *)&extraOptions);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&testerName);
    bVar4 = false;
  }
  std::__cxx11::string::~string((string *)&memoryTesterOptions);
  return bVar4;
}

Assistant:

bool cmCTestMemCheckHandler::InitializeMemoryChecking()
{
  this->MemoryTesterEnvironmentVariable.clear();
  this->MemoryTester.clear();
  // Setup the command
  if (cmSystemTools::FileExists(
        this->CTest->GetCTestConfiguration("MemoryCheckCommand"))) {
    this->MemoryTester =
      this->CTest->GetCTestConfiguration("MemoryCheckCommand");
    std::string testerName =
      cmSystemTools::GetFilenameName(this->MemoryTester);
    // determine the checker type
    if (testerName.find("valgrind") != std::string::npos ||
        this->CTest->GetCTestConfiguration("MemoryCheckType") == "Valgrind") {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::VALGRIND;
    } else if (testerName.find("purify") != std::string::npos) {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::PURIFY;
    } else if (testerName.find("BC") != std::string::npos) {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::BOUNDS_CHECKER;
    } else {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::UNKNOWN;
    }
  } else if (cmSystemTools::FileExists(
               this->CTest->GetCTestConfiguration("PurifyCommand"))) {
    this->MemoryTester = this->CTest->GetCTestConfiguration("PurifyCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::PURIFY;
  } else if (cmSystemTools::FileExists(
               this->CTest->GetCTestConfiguration("ValgrindCommand"))) {
    this->MemoryTester = this->CTest->GetCTestConfiguration("ValgrindCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::VALGRIND;
  } else if (cmSystemTools::FileExists(
               this->CTest->GetCTestConfiguration("BoundsCheckerCommand"))) {
    this->MemoryTester =
      this->CTest->GetCTestConfiguration("BoundsCheckerCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::BOUNDS_CHECKER;
  }
  if (this->CTest->GetCTestConfiguration("MemoryCheckType") ==
      "AddressSanitizer") {
    this->MemoryTester = this->CTest->GetCTestConfiguration("CMakeCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::ADDRESS_SANITIZER;
    this->LogWithPID = true; // even if we give the log file the pid is added
  }
  if (this->CTest->GetCTestConfiguration("MemoryCheckType") ==
      "LeakSanitizer") {
    this->MemoryTester = this->CTest->GetCTestConfiguration("CMakeCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::LEAK_SANITIZER;
    this->LogWithPID = true; // even if we give the log file the pid is added
  }
  if (this->CTest->GetCTestConfiguration("MemoryCheckType") ==
      "ThreadSanitizer") {
    this->MemoryTester = this->CTest->GetCTestConfiguration("CMakeCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::THREAD_SANITIZER;
    this->LogWithPID = true; // even if we give the log file the pid is added
  }
  if (this->CTest->GetCTestConfiguration("MemoryCheckType") ==
      "MemorySanitizer") {
    this->MemoryTester = this->CTest->GetCTestConfiguration("CMakeCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::MEMORY_SANITIZER;
    this->LogWithPID = true; // even if we give the log file the pid is added
  }
  if (this->CTest->GetCTestConfiguration("MemoryCheckType") ==
      "UndefinedBehaviorSanitizer") {
    this->MemoryTester = this->CTest->GetCTestConfiguration("CMakeCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::UB_SANITIZER;
    this->LogWithPID = true; // even if we give the log file the pid is added
  }
  // Check the MemoryCheckType
  if (this->MemoryTesterStyle == cmCTestMemCheckHandler::UNKNOWN) {
    std::string checkType =
      this->CTest->GetCTestConfiguration("MemoryCheckType");
    if (checkType == "Purify") {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::PURIFY;
    } else if (checkType == "BoundsChecker") {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::BOUNDS_CHECKER;
    } else if (checkType == "Valgrind") {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::VALGRIND;
    }
  }
  if (this->MemoryTester.empty()) {
    cmCTestOptionalLog(this->CTest, WARNING,
                       "Memory checker (MemoryCheckCommand) "
                       "not set, or cannot find the specified program."
                         << std::endl,
                       this->Quiet);
    return false;
  }

  // Setup the options
  std::string memoryTesterOptions;
  if (!this->CTest->GetCTestConfiguration("MemoryCheckCommandOptions")
         .empty()) {
    memoryTesterOptions =
      this->CTest->GetCTestConfiguration("MemoryCheckCommandOptions");
  } else if (!this->CTest->GetCTestConfiguration("ValgrindCommandOptions")
                .empty()) {
    memoryTesterOptions =
      this->CTest->GetCTestConfiguration("ValgrindCommandOptions");
  }
  this->MemoryTesterOptions =
    cmSystemTools::ParseArguments(memoryTesterOptions);

  this->MemoryTesterOutputFile =
    this->CTest->GetBinaryDir() + "/Testing/Temporary/MemoryChecker.??.log";

  switch (this->MemoryTesterStyle) {
    case cmCTestMemCheckHandler::VALGRIND: {
      if (this->MemoryTesterOptions.empty()) {
        this->MemoryTesterOptions.emplace_back("-q");
        this->MemoryTesterOptions.emplace_back("--tool=memcheck");
        this->MemoryTesterOptions.emplace_back("--leak-check=yes");
        this->MemoryTesterOptions.emplace_back("--show-reachable=yes");
        this->MemoryTesterOptions.emplace_back("--num-callers=50");
      }
      if (!this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile")
             .empty()) {
        if (!cmSystemTools::FileExists(this->CTest->GetCTestConfiguration(
              "MemoryCheckSuppressionFile"))) {
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "Cannot find memory checker suppression file: "
                       << this->CTest->GetCTestConfiguration(
                            "MemoryCheckSuppressionFile")
                       << std::endl);
          return false;
        }
        this->MemoryTesterOptions.push_back(
          "--suppressions=" +
          this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile"));
      }
      this->MemoryTesterDynamicOptions.push_back("--log-file=" +
                                                 this->MemoryTesterOutputFile);
      break;
    }
    case cmCTestMemCheckHandler::PURIFY: {
      std::string outputFile;
#ifdef _WIN32
      if (this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile")
            .size()) {
        if (!cmSystemTools::FileExists(this->CTest->GetCTestConfiguration(
              "MemoryCheckSuppressionFile"))) {
          cmCTestLog(
            this->CTest, ERROR_MESSAGE,
            "Cannot find memory checker suppression file: "
              << this->CTest
                   ->GetCTestConfiguration("MemoryCheckSuppressionFile")
                   .c_str()
              << std::endl);
          return false;
        }
        std::string filterFiles = "/FilterFiles=" +
          this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile");
        this->MemoryTesterOptions.push_back(filterFiles);
      }
      outputFile = "/SAVETEXTDATA=";
#else
      outputFile = "-log-file=";
#endif
      outputFile += this->MemoryTesterOutputFile;
      this->MemoryTesterDynamicOptions.push_back(outputFile);
      break;
    }
    case cmCTestMemCheckHandler::BOUNDS_CHECKER: {
      this->BoundsCheckerXMLFile = this->MemoryTesterOutputFile;
      std::string dpbdFile = this->CTest->GetBinaryDir() +
        "/Testing/Temporary/MemoryChecker.??.DPbd";
      this->BoundsCheckerDPBDFile = dpbdFile;
      this->MemoryTesterDynamicOptions.emplace_back("/B");
      this->MemoryTesterDynamicOptions.push_back(std::move(dpbdFile));
      this->MemoryTesterDynamicOptions.emplace_back("/X");
      this->MemoryTesterDynamicOptions.push_back(this->MemoryTesterOutputFile);
      this->MemoryTesterOptions.emplace_back("/M");
      break;
    }
    // these are almost the same but the env var used is different
    case cmCTestMemCheckHandler::ADDRESS_SANITIZER:
    case cmCTestMemCheckHandler::LEAK_SANITIZER:
    case cmCTestMemCheckHandler::THREAD_SANITIZER:
    case cmCTestMemCheckHandler::MEMORY_SANITIZER:
    case cmCTestMemCheckHandler::UB_SANITIZER: {
      // To pass arguments to ThreadSanitizer the environment variable
      // TSAN_OPTIONS is used. This is done with the cmake -E env command.
      // The MemoryTesterDynamicOptions is setup with the -E env
      // Then the MemoryTesterEnvironmentVariable gets the
      // TSAN_OPTIONS string with the log_path in it.
      this->MemoryTesterDynamicOptions.emplace_back("-E");
      this->MemoryTesterDynamicOptions.emplace_back("env");
      std::string envVar;
      std::string extraOptions;
      std::string suppressionsOption;
      if (!this->CTest->GetCTestConfiguration("MemoryCheckSanitizerOptions")
             .empty()) {
        extraOptions = ":" +
          this->CTest->GetCTestConfiguration("MemoryCheckSanitizerOptions");
      }
      if (!this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile")
             .empty()) {
        suppressionsOption = ":suppressions=" +
          this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile");
      }
      if (this->MemoryTesterStyle ==
          cmCTestMemCheckHandler::ADDRESS_SANITIZER) {
        envVar = "ASAN_OPTIONS";
      } else if (this->MemoryTesterStyle ==
                 cmCTestMemCheckHandler::LEAK_SANITIZER) {
        envVar = "LSAN_OPTIONS";
      } else if (this->MemoryTesterStyle ==
                 cmCTestMemCheckHandler::THREAD_SANITIZER) {
        envVar = "TSAN_OPTIONS";
      } else if (this->MemoryTesterStyle ==
                 cmCTestMemCheckHandler::MEMORY_SANITIZER) {
        envVar = "MSAN_OPTIONS";
      } else if (this->MemoryTesterStyle ==
                 cmCTestMemCheckHandler::UB_SANITIZER) {
        envVar = "UBSAN_OPTIONS";
      }
      // Quote log_path with single quotes; see
      // https://bugs.chromium.org/p/chromium/issues/detail?id=467936
      std::string outputFile =
        envVar + "=log_path='" + this->MemoryTesterOutputFile + "'";
      this->MemoryTesterEnvironmentVariable =
        outputFile + suppressionsOption + extraOptions;
      break;
    }
    default:
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Do not understand memory checker: " << this->MemoryTester
                                                      << std::endl);
      return false;
  }

  this->InitializeResultsVectors();
  // std::vector<std::string>::size_type cc;
  // for ( cc = 0; cmCTestMemCheckResultStrings[cc]; cc ++ )
  //   {
  //   this->MemoryTesterGlobalResults[cc] = 0;
  //   }
  return true;
}